

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O0

void __thiscall dynamicgraph::SignalPtr<double,int>::accessCopy(SignalPtr<double,int> *this)

{
  SignalPtr<double,_int>::accessCopy
            ((SignalPtr<double,_int> *)(this + *(long *)(*(long *)this + -0xf8)));
  return;
}

Assistant:

const T &SignalPtr<T, Time>::accessCopy() const {
  if (modeNoThrow && (!isPlugged()) && Signal<T, Time>::copyInit)
    return Signal<T, Time>::accessCopy();
  else if (autoref())
    return Signal<T, Time>::accessCopy();
  else if (transmitAbstract)
    return *transmitAbstractData;
  else
    return getPtr()->accessCopy();
}